

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>
          (ChArchiveIn *this,ChNameValue<chrono::ChEnumMapper<chrono::AngleSet>_> *bVal)

{
  ChNameValue<chrono::ChEnumMapper<chrono::AngleSet>_> local_28;
  
  local_28._name = bVal->_name;
  local_28._value = bVal->_value;
  local_28._flags = bVal->_flags;
  in<chrono::AngleSet>(this,&local_28);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }